

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_window_update(nghttp2_bufs *bufs,nghttp2_window_update *frame)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_buf *buf;
  nghttp2_window_update *frame_local;
  nghttp2_bufs *bufs_local;
  
  if (bufs->head != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x2c0,
                  "int nghttp2_frame_pack_window_update(nghttp2_bufs *, nghttp2_window_update *)");
  }
  pnVar1 = bufs->head;
  if (3 < (ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last)) {
    (pnVar1->buf).pos = (pnVar1->buf).pos + -9;
    nghttp2_frame_pack_frame_hd((pnVar1->buf).pos,&frame->hd);
    nghttp2_put_uint32be((pnVar1->buf).last,frame->window_size_increment);
    (pnVar1->buf).last = (pnVar1->buf).last + 4;
    return 0;
  }
  __assert_fail("nghttp2_buf_avail(buf) >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x2c4,
                "int nghttp2_frame_pack_window_update(nghttp2_bufs *, nghttp2_window_update *)");
}

Assistant:

int nghttp2_frame_pack_window_update(nghttp2_bufs *bufs,
                                     nghttp2_window_update *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= 4);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, (uint32_t)frame->window_size_increment);
  buf->last += 4;

  return 0;
}